

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall lest::got_none::got_none(got_none *this,location *where_,text *expr_)

{
  allocator local_101;
  string local_100 [32];
  text local_e0;
  text local_c0;
  location local_a0;
  allocator local_61;
  string local_60 [32];
  text local_40;
  text *local_20;
  text *expr__local;
  location *where__local;
  got_none *this_local;
  
  local_20 = expr_;
  expr__local = &where_->file;
  where__local = (location *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"passed: got no exception",&local_61);
  std::__cxx11::string::string((string *)&local_40,local_60);
  location::location(&local_a0,where_);
  std::__cxx11::string::string((string *)&local_c0,(string *)expr_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"",&local_101);
  std::__cxx11::string::string((string *)&local_e0,local_100);
  success::success(&this->super_success,&local_40,&local_a0,&local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::__cxx11::string::~string((string *)&local_c0);
  location::~location(&local_a0);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  *(undefined ***)&(this->super_success).super_message = &PTR__got_none_00205d50;
  return;
}

Assistant:

got_none( location where_, text expr_)
    : success( "passed: got no exception", where_, expr_) {}